

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O3

int SUNLogger_SetErrorFilename(SUNLogger logger,char *error_filename)

{
  int iVar1;
  
  if (logger == (SUNLogger)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if ((error_filename != (char *)0x0) && (iVar1 = 0, *error_filename != '\0')) {
      SUNLogger_SetErrorFilename_cold_1();
    }
  }
  return iVar1;
}

Assistant:

int SUNLogger_SetErrorFilename(SUNLogger logger, const char* error_filename)
{
  if (logger == NULL)
  {
    return -1;
  }

  if (!sunLoggerIsOutputRank(logger, NULL))
  {
    return 0;
  }

  if (error_filename && strcmp(error_filename, ""))
  {
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_ERROR
    FILE* fp = NULL;
    if (!SUNHashMap_GetValue(logger->filenames, error_filename, (void*)&fp))
    {
      logger->error_fp = fp;
    }
    else
    {
      logger->error_fp = sunOpenLogFile(error_filename, "w+");
      if (logger->error_fp)
      {
        SUNHashMap_Insert(logger->filenames, error_filename,
                          (void*)logger->error_fp);
      }
      else
      {
        return -1;
      }
    }
#else
    fprintf(stderr,
            "[LOGGER WARNING] "
            "SUNDIALS_LOGGING_LEVEL=%d (build time option) "
            "is set too low for ERROR, but a ERROR file was provided. "
            "Set the logging level to >= %d and recompile if ERROR output level "
            "is desired.\n", SUN_LOGLEVEL_ERROR, SUNDIALS_LOGGING_LEVEL);
#endif
  }

  return 0;
}